

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.cpp
# Opt level: O1

void __thiscall
SQCompilation::SwitchStatement::visitChildren(SwitchStatement *this,Visitor *visitor)

{
  Node *this_00;
  SwitchCase *c;
  SwitchCase *pSVar1;
  ulong uVar2;
  SwitchCase *pSVar3;
  
  Node::visit<SQCompilation::Visitor>(&this->_expr->super_Node,visitor);
  uVar2 = (ulong)(this->_cases)._size;
  if (uVar2 != 0) {
    pSVar1 = (this->_cases)._vals;
    pSVar3 = pSVar1 + uVar2;
    do {
      Node::visit<SQCompilation::Visitor>(&pSVar1->val->super_Node,visitor);
      Node::visit<SQCompilation::Visitor>(&pSVar1->stmt->super_Node,visitor);
      pSVar1 = pSVar1 + 1;
    } while (pSVar1 != pSVar3);
  }
  this_00 = &((this->_defaultCase).stmt)->super_Node;
  if (this_00 != (Node *)0x0) {
    Node::visit<SQCompilation::Visitor>(this_00,visitor);
    return;
  }
  return;
}

Assistant:

void SwitchStatement::visitChildren(Visitor *visitor) {
    _expr->visit(visitor);

    for (auto &c : cases()) {
        c.val->visit(visitor);
        c.stmt->visit(visitor);
    }

    if (_defaultCase.stmt) {
        _defaultCase.stmt->visit(visitor);
    }
}